

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O2

void __thiscall xmrig::CpuBackend::setJob(CpuBackend *this,Job *job)

{
  CpuLaunchData *__first1;
  CpuLaunchData *__last1;
  bool bVar1;
  int iVar2;
  Config *this_00;
  CpuConfig *this_01;
  Miner *miner;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> threads;
  
  iVar2 = (*(this->super_IBackend)._vptr_IBackend[2])();
  if ((char)iVar2 != '\0') {
    this_00 = Base::config(&this->d_ptr->controller->super_Base);
    this_01 = Config::cpu(this_00);
    miner = Controller::miner(this->d_ptr->controller);
    CpuConfig::get(&threads,this_01,miner);
    __first1 = (this->d_ptr->threads).
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start;
    __last1 = (this->d_ptr->threads).
              super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (((__first1 == __last1) ||
        ((long)__last1 - (long)__first1 !=
         (long)threads.
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)threads.
               super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
               _M_impl.super__Vector_impl_data._M_start)) ||
       (bVar1 = std::__equal<false>::equal<xmrig::CpuLaunchData*,xmrig::CpuLaunchData*>
                          (__first1,__last1,
                           threads.
                           super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>
                           ._M_impl.super__Vector_impl_data._M_start), !bVar1)) {
      if (threads.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          threads.super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        Log::print(WARNING,
                   "%s \x1b[1;31mdisabled\x1b[0m\x1b[0;33m (no suitable configuration found)\x1b[0m"
                   ,"\x1b[46;1m\x1b[1;37m cpu \x1b[0m");
        (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
      }
      else {
        (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
        std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::_M_move_assign
                  (&this->d_ptr->threads,&threads);
        CpuBackendPrivate::start(this->d_ptr);
      }
    }
    std::_Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::~_Vector_base
              (&threads.
                super__Vector_base<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>);
    return;
  }
  (*(this->super_IBackend)._vptr_IBackend[0xb])(this);
  return;
}

Assistant:

void xmrig::CpuBackend::setJob(const Job &job)
{
    if (!isEnabled()) {
        return stop();
    }

    const CpuConfig &cpu = d_ptr->controller->config()->cpu();

    std::vector<CpuLaunchData> threads = cpu.get(d_ptr->controller->miner());
    if (!d_ptr->threads.empty() && d_ptr->threads.size() == threads.size() && std::equal(d_ptr->threads.begin(), d_ptr->threads.end(), threads.begin())) {
        return;
    }

    if (threads.empty()) {
        LOG_WARN("%s " RED_BOLD("disabled") YELLOW(" (no suitable configuration found)"), tag);

        return stop();
    }

    stop();

    d_ptr->threads = std::move(threads);
    d_ptr->start();
}